

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O0

int Saig_ManPhasePrefixLength(Aig_Man_t *p,int fVerbose,int fVeryVerbose,Vec_Int_t **pvTrans)

{
  int iVar1;
  uint nLoop;
  uint uVar2;
  Saig_Tsim_t *p_00;
  uint *pState;
  Vec_Int_t *pVVar3;
  int nNonXRegs;
  int nPrefix;
  int nFrames;
  Saig_Tsim_t *pTsi;
  Vec_Int_t **pvTrans_local;
  int fVeryVerbose_local;
  int fVerbose_local;
  Aig_Man_t *p_local;
  
  iVar1 = Saig_ManRegNum(p);
  if (iVar1 == 0) {
    __assert_fail("Saig_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                  ,0x36b,"int Saig_ManPhasePrefixLength(Aig_Man_t *, int, int, Vec_Int_t **)");
  }
  iVar1 = Saig_ManPiNum(p);
  if (iVar1 != 0) {
    iVar1 = Saig_ManPoNum(p);
    if (iVar1 != 0) {
      p_00 = Saig_ManReachableTernary(p,(Vec_Int_t *)0x0,0);
      if (p_00 == (Saig_Tsim_t *)0x0) {
        p_local._4_4_ = 0;
      }
      else {
        pState = (uint *)Vec_PtrEntryLast(p_00->vStates);
        p_local._4_4_ = Saig_TsiComputePrefix(p_00,pState,p_00->nWords);
        iVar1 = Vec_PtrSize(p_00->vStates);
        nLoop = (iVar1 + -1) - p_local._4_4_;
        uVar2 = Saig_TsiCountNonXValuedRegisters(p_00,p_local._4_4_);
        if (pvTrans != (Vec_Int_t **)0x0) {
          pVVar3 = Saig_TsiComputeTransient(p_00,p_local._4_4_);
          *pvTrans = pVVar3;
        }
        if (fVerbose != 0) {
          printf("Lead = %5d. Loop = %5d.  Total flops = %5d. Binary flops = %5d.\n",
                 (ulong)p_local._4_4_,(ulong)nLoop,(ulong)(uint)p->nRegs,(ulong)uVar2);
        }
        if (fVeryVerbose != 0) {
          Saig_TsiPrintTraces(p_00,p_00->nWords,p_local._4_4_,nLoop);
        }
        Saig_TsiStop(p_00);
      }
      return p_local._4_4_;
    }
    __assert_fail("Saig_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                  ,0x36d,"int Saig_ManPhasePrefixLength(Aig_Man_t *, int, int, Vec_Int_t **)");
  }
  __assert_fail("Saig_ManPiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                ,0x36c,"int Saig_ManPhasePrefixLength(Aig_Man_t *, int, int, Vec_Int_t **)");
}

Assistant:

int Saig_ManPhasePrefixLength( Aig_Man_t * p, int fVerbose, int fVeryVerbose, Vec_Int_t ** pvTrans )
{
    Saig_Tsim_t * pTsi;
    int nFrames, nPrefix, nNonXRegs;
    assert( Saig_ManRegNum(p) );
    assert( Saig_ManPiNum(p) );
    assert( Saig_ManPoNum(p) );
    // perform terminary simulation
    pTsi = Saig_ManReachableTernary( p, NULL, 0 );
    if ( pTsi == NULL )
        return 0;
    // derive information
    nPrefix   = Saig_TsiComputePrefix( pTsi, (unsigned *)Vec_PtrEntryLast(pTsi->vStates), pTsi->nWords );
    nFrames   = Vec_PtrSize(pTsi->vStates) - 1 - nPrefix;
    nNonXRegs = Saig_TsiCountNonXValuedRegisters( pTsi, nPrefix );

    if ( pvTrans )
        *pvTrans = Saig_TsiComputeTransient( pTsi, nPrefix );

    // print statistics
    if ( fVerbose )
        printf( "Lead = %5d. Loop = %5d.  Total flops = %5d. Binary flops = %5d.\n", nPrefix, nFrames, p->nRegs, nNonXRegs );
    if ( fVeryVerbose )
        Saig_TsiPrintTraces( pTsi, pTsi->nWords, nPrefix, nFrames );
    Saig_TsiStop( pTsi );
    // potentially, may need to reduce nFrames if nPrefix is less than nFrames
    return nPrefix;
}